

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_get_system_colors.cxx
# Opt level: O1

int Fl::scheme(char *s)

{
  int iVar1;
  Fl_Window *pFVar2;
  char *pcVar3;
  char *pcVar4;
  
  if (s == (char *)0x0) {
    s = getenv("FLTK_SCHEME");
    if (s == (char *)0x0) {
      pFVar2 = first_window();
      if (pFVar2 == (Fl_Window *)0x0) {
        pcVar3 = (char *)0x0;
      }
      else {
        pFVar2 = first_window();
        pcVar3 = Fl_Window::xclass(pFVar2);
      }
      pcVar4 = "fltk";
      if (pcVar3 != (char *)0x0) {
        pcVar4 = pcVar3;
      }
      fl_open_display();
      s = (char *)XGetDefault(fl_display,pcVar4,"scheme");
    }
  }
  if (s != (char *)0x0) {
    iVar1 = fl_ascii_strcasecmp(s,"none");
    if (iVar1 != 0) {
      iVar1 = fl_ascii_strcasecmp(s,"base");
      if ((iVar1 != 0) && (*s != '\0')) {
        iVar1 = fl_ascii_strcasecmp(s,"gtk+");
        if (iVar1 == 0) {
          pcVar3 = "gtk+";
        }
        else {
          iVar1 = fl_ascii_strcasecmp(s,"plastic");
          if (iVar1 == 0) {
            pcVar3 = "plastic";
          }
          else {
            iVar1 = fl_ascii_strcasecmp(s,"gleam");
            if (iVar1 != 0) goto LAB_001df7b4;
            pcVar3 = "gleam";
          }
        }
        pcVar3 = strdup(pcVar3);
        goto LAB_001df7b6;
      }
    }
  }
LAB_001df7b4:
  pcVar3 = (char *)0x0;
LAB_001df7b6:
  if (scheme_ != (char *)0x0) {
    free(scheme_);
  }
  builtin_strncpy(scheme::e,"FLTK_SCHEME=",0xd);
  scheme_ = pcVar3;
  if (pcVar3 != (char *)0x0) {
    fl_strlcat(scheme::e,pcVar3,0x400);
  }
  putenv(scheme::e);
  reload_scheme();
  return 1;
}

Assistant:

int Fl::scheme(const char *s) {
  if (!s) {
    if ((s = getenv("FLTK_SCHEME")) == NULL) {
#if !defined(WIN32) && !defined(__APPLE__)
      const char* key = 0;
      if (Fl::first_window()) key = Fl::first_window()->xclass();
      if (!key) key = "fltk";
      fl_open_display();
      s = XGetDefault(fl_display, key, "scheme");
#endif // !WIN32 && !__APPLE__
    }
  }

  if (s) {
    if (!fl_ascii_strcasecmp(s, "none") || !fl_ascii_strcasecmp(s, "base") || !*s) s = 0;
    else if (!fl_ascii_strcasecmp(s, "gtk+")) s = strdup("gtk+");
    else if (!fl_ascii_strcasecmp(s, "plastic")) s = strdup("plastic");
    else if (!fl_ascii_strcasecmp(s, "gleam")) s = strdup("gleam");
    else s = 0;
  }
  if (scheme_) free((void*)scheme_);
  scheme_ = s;

  // Save the new scheme in the FLTK_SCHEME env var so that child processes
  // inherit it...
  static char e[1024];
  strcpy(e,"FLTK_SCHEME=");
  if (s) strlcat(e,s,sizeof(e));
  putenv(e);

  // Load the scheme...
  return reload_scheme();
}